

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * __thiscall
wasm::anon_unknown_0::printMemoryName(anon_unknown_0 *this,Name name,ostream *o,Module *wasm)

{
  size_type sVar1;
  ostream *o_00;
  Module *wasm_local;
  ostream *o_local;
  Name name_local;
  
  o_00 = name.super_IString.str._M_str;
  name_local.super_IString.str._M_len = name.super_IString.str._M_len;
  o_local = (ostream *)this;
  if ((o != (ostream *)0x0) &&
     (sVar1 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::size((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                      *)(o + 0x78)), sVar1 < 2)) {
    return o_00;
  }
  std::operator<<(o_00,' ');
  wasm::Name::print((Name *)&o_local,o_00);
  return o_00;
}

Assistant:

std::ostream& printMemoryName(Name name, std::ostream& o, Module* wasm) {
  if (!wasm || wasm->memories.size() > 1) {
    o << ' ';
    name.print(o);
  }
  return o;
}